

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfFile.cpp
# Opt level: O0

void __thiscall
ElfFile::loadProgramHeader(ElfFile *this,Elf32_Phdr *header,ByteArray *data,size_t pos)

{
  Endianness endianness_00;
  Elf32_Word EVar1;
  Elf32_Off EVar2;
  Elf32_Addr EVar3;
  Endianness endianness;
  size_t pos_local;
  ByteArray *data_local;
  Elf32_Phdr *header_local;
  ElfFile *this_local;
  
  endianness_00 = getEndianness(this);
  EVar1 = ByteArray::getDoubleWord(data,pos,endianness_00);
  header->p_type = EVar1;
  EVar2 = ByteArray::getDoubleWord(data,pos + 4,endianness_00);
  header->p_offset = EVar2;
  EVar3 = ByteArray::getDoubleWord(data,pos + 8,endianness_00);
  header->p_vaddr = EVar3;
  EVar3 = ByteArray::getDoubleWord(data,pos + 0xc,endianness_00);
  header->p_paddr = EVar3;
  EVar1 = ByteArray::getDoubleWord(data,pos + 0x10,endianness_00);
  header->p_filesz = EVar1;
  EVar1 = ByteArray::getDoubleWord(data,pos + 0x14,endianness_00);
  header->p_memsz = EVar1;
  EVar1 = ByteArray::getDoubleWord(data,pos + 0x18,endianness_00);
  header->p_flags = EVar1;
  EVar1 = ByteArray::getDoubleWord(data,pos + 0x1c,endianness_00);
  header->p_align = EVar1;
  return;
}

Assistant:

void ElfFile::loadProgramHeader(Elf32_Phdr& header, ByteArray& data, size_t pos)
{
	Endianness endianness = getEndianness();
	header.p_type   = data.getDoubleWord(pos + 0x00, endianness);
	header.p_offset = data.getDoubleWord(pos + 0x04, endianness);
	header.p_vaddr  = data.getDoubleWord(pos + 0x08, endianness);
	header.p_paddr  = data.getDoubleWord(pos + 0x0C, endianness);
	header.p_filesz = data.getDoubleWord(pos + 0x10, endianness);
	header.p_memsz  = data.getDoubleWord(pos + 0x14, endianness);
	header.p_flags  = data.getDoubleWord(pos + 0x18, endianness);
	header.p_align  = data.getDoubleWord(pos + 0x1C, endianness);
}